

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDConstructGridGlobal.hpp
# Opt level: O0

vector<double,_std::allocator<double>_> *
TasGrid::listToNodes<TasGrid::GridSequence>
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> *node_list,
          size_t num_dimensions,GridSequence *rule)

{
  bool bVar1;
  difference_type a;
  size_t sVar2;
  reference list;
  NodeData *t;
  const_iterator __end2;
  const_iterator __begin2;
  forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> *__range2;
  iterator ix;
  allocator<double> local_41;
  _Fwd_list_node_base *local_40;
  _Fwd_list_const_iterator<TasGrid::NodeData> local_38;
  undefined1 local_29;
  GridSequence *local_28;
  GridSequence *rule_local;
  size_t num_dimensions_local;
  forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> *node_list_local;
  vector<double,_std::allocator<double>_> *result;
  
  local_29 = 0;
  local_28 = rule;
  rule_local = (GridSequence *)num_dimensions;
  num_dimensions_local = (size_t)node_list;
  node_list_local =
       (forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> *)__return_storage_ptr__
  ;
  local_38._M_node =
       (_Fwd_list_node_base *)
       ::std::forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>::begin
                 ((forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> *)node_list);
  local_40 = (_Fwd_list_node_base *)
             ::std::forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>::end
                       ((forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> *)
                        num_dimensions_local);
  a = ::std::distance<std::_Fwd_list_const_iterator<TasGrid::NodeData>>
                (local_38,(_Fwd_list_const_iterator<TasGrid::NodeData>)local_40);
  sVar2 = Utils::size_mult<long,unsigned_long>(a,(unsigned_long)rule_local);
  ::std::allocator<double>::allocator(&local_41);
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)__return_storage_ptr__,sVar2,&local_41);
  ::std::allocator<double>::~allocator(&local_41);
  __range2 = (forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> *)
             ::std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)__return_storage_ptr__);
  sVar2 = num_dimensions_local;
  __end2._M_node =
       (_Fwd_list_node_base *)
       ::std::forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>::begin
                 ((forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> *)
                  num_dimensions_local);
  t = (NodeData *)
      ::std::forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>::end
                ((forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> *)sVar2);
  while (bVar1 = ::std::operator!=((_Self *)&__end2,(_Self *)&t), bVar1) {
    list = ::std::_Fwd_list_const_iterator<TasGrid::NodeData>::operator*
                     ((_Fwd_list_const_iterator<TasGrid::NodeData> *)&__end2);
    __range2 = (forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> *)
               MultiIndexManipulations::
               indexesToNodes<std::vector<int,std::allocator<int>>,TasGrid::GridSequence,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                         ((vector<int,_std::allocator<int>_> *)list,local_28,
                          (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                           )__range2);
    ::std::_Fwd_list_const_iterator<TasGrid::NodeData>::operator++
              ((_Fwd_list_const_iterator<TasGrid::NodeData> *)&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> listToNodes(std::forward_list<NodeData> const &node_list, size_t num_dimensions, RuleLike const &rule){
    std::vector<double> result(Utils::size_mult(std::distance(node_list.begin(), node_list.end()), num_dimensions));
    auto ix = result.begin();
    for(auto const &t : node_list)
        ix = MultiIndexManipulations::indexesToNodes(t.point, rule, ix);
    return result;
}